

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.h
# Opt level: O2

UninterpretedOption *
google::protobuf::DynamicCastMessage<google::protobuf::UninterpretedOption>(MessageLite *from)

{
  int iVar1;
  long lVar2;
  undefined4 extraout_var;
  UninterpretedOption *pUVar3;
  
  if (from != (MessageLite *)0x0) {
    lVar2 = (**(code **)(_UninterpretedOption_default_instance_ + 0x20))();
    iVar1 = (*from->_vptr_MessageLite[4])(from);
    pUVar3 = (UninterpretedOption *)0x0;
    if (lVar2 == CONCAT44(extraout_var,iVar1)) {
      pUVar3 = (UninterpretedOption *)from;
    }
    return pUVar3;
  }
  return (UninterpretedOption *)0x0;
}

Assistant:

const T* DynamicCastMessage(const MessageLite* from) {
  static_assert(std::is_base_of<MessageLite, T>::value, "");

  // We might avoid the call to T::GetClassData() altogether if T were to
  // expose the class data pointer.
  if (from == nullptr || TypeId::Get<T>() != TypeId::Get(*from)) {
    return nullptr;
  }

  return static_cast<const T*>(from);
}